

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<13,_12,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_3,_4> *mat;
  Type in0;
  MatrixCaseUtils local_bc [12];
  MatrixCaseUtils local_b0 [12];
  tcu local_a4 [12];
  Mat4x3 local_98;
  VecAccess<float,_4,_3> local_68;
  Matrix<float,_3,_4> local_50;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,12>(&local_98,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_4>::Matrix(&local_98,(float *)s_constInMat4x3);
  }
  reduceToVec3(local_b0,&local_98);
  increment<float,3,4>(&local_50,(MatrixCaseUtils *)&local_98,mat);
  reduceToVec3(local_bc,&local_50);
  tcu::operator+(local_a4,(Vector<float,_3> *)local_b0,(Vector<float,_3> *)local_bc);
  local_68.m_vector = &evalCtx->color;
  local_68.m_index[0] = 0;
  local_68.m_index[1] = 1;
  local_68.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_68,(Vector<float,_3> *)local_a4);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(increment(in0));
	}